

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O1

bool qt_closestItemFirst(QGraphicsItem *item1,QGraphicsItem *item2)

{
  qreal *pqVar1;
  double dVar2;
  QGraphicsItemPrivate *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  QGraphicsItem *pQVar5;
  QGraphicsItem *pQVar6;
  int iVar7;
  QGraphicsItem *pQVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  
  pQVar3 = (item1->d_ptr).d;
  pQVar4 = (item2->d_ptr).d;
  if (pQVar3->parent != pQVar4->parent) {
    if (pQVar3->itemDepth == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar3);
    }
    iVar9 = pQVar3->itemDepth;
    if (pQVar4->itemDepth == -1) {
      QGraphicsItemPrivate::resolveDepth(pQVar4);
    }
    iVar7 = pQVar4->itemDepth;
    iVar10 = iVar9;
    pQVar8 = item1;
    for (; iVar7 < iVar9; iVar9 = iVar9 + -1) {
      pQVar3 = (pQVar8->d_ptr).d;
      pQVar5 = pQVar3->parent;
      iVar10 = iVar9;
      if (pQVar5 == (QGraphicsItem *)0x0) break;
      if (pQVar5 == item2) {
        return (*(ulong *)&pQVar3->field_0x160 & 0x10000000000) == 0;
      }
      iVar10 = iVar7;
      pQVar8 = pQVar5;
    }
    do {
      if (iVar7 <= iVar10) goto LAB_005fa3ff;
      pQVar3 = (item2->d_ptr).d;
      pQVar5 = pQVar3->parent;
      if (pQVar5 == (QGraphicsItem *)0x0) goto LAB_005fa3ff;
      if (pQVar5 == item1) {
        uVar11 = *(ulong *)&pQVar3->field_0x160 & 0x10000000000;
        goto LAB_005fa475;
      }
      iVar7 = iVar7 + -1;
      item2 = pQVar5;
    } while( true );
  }
  uVar11 = *(ulong *)&pQVar4->field_0x160 & 0x10000000000;
  if (((uint)((ulong)*(undefined8 *)&pQVar3->field_0x160 >> 0x28) & 1) != (uint)(uVar11 >> 0x28))
  goto LAB_005fa475;
  dVar2 = pQVar3->z;
  pqVar1 = &pQVar4->z;
  bVar12 = dVar2 == *pqVar1;
  bVar13 = dVar2 < *pqVar1;
  if ((bVar12) && (!NAN(dVar2) && !NAN(*pqVar1))) {
    iVar7 = pQVar3->siblingIndex;
    iVar9 = pQVar4->siblingIndex;
    bVar13 = SBORROW4(iVar7,iVar9);
    iVar10 = iVar7 - iVar9;
    bVar12 = iVar7 == iVar9;
LAB_005fa49b:
    return !bVar12 && bVar13 == iVar10 < 0;
  }
  goto LAB_005fa46d;
LAB_005fa3ff:
  if ((pQVar8 != (QGraphicsItem *)0x0) && (pQVar5 = pQVar8, pQVar6 = item2, pQVar8 != item2)) {
    do {
      item2 = pQVar6;
      pQVar8 = pQVar5;
      pQVar5 = ((pQVar8->d_ptr).d)->parent;
      if (pQVar5 == (QGraphicsItem *)0x0) break;
      pQVar6 = ((item2->d_ptr).d)->parent;
    } while (pQVar5 != pQVar6);
  }
  pQVar3 = (pQVar8->d_ptr).d;
  pQVar4 = (item2->d_ptr).d;
  uVar11 = *(ulong *)&pQVar4->field_0x160 & 0x10000000000;
  if (((uint)((ulong)*(undefined8 *)&pQVar3->field_0x160 >> 0x28) & 1) != (uint)(uVar11 >> 0x28)) {
LAB_005fa475:
    return uVar11 != 0;
  }
  dVar2 = pQVar3->z;
  pqVar1 = &pQVar4->z;
  bVar12 = dVar2 == *pqVar1;
  bVar13 = dVar2 < *pqVar1;
  if ((bVar12) && (!NAN(dVar2) && !NAN(*pqVar1))) {
    iVar7 = pQVar3->siblingIndex;
    iVar9 = pQVar4->siblingIndex;
    bVar13 = SBORROW4(iVar7,iVar9);
    iVar10 = iVar7 - iVar9;
    bVar12 = iVar7 == iVar9;
    goto LAB_005fa49b;
  }
LAB_005fa46d:
  return !bVar13 && !bVar12;
}

Assistant:

inline bool qt_closestItemFirst(const QGraphicsItem *item1, const QGraphicsItem *item2)
{
    // Siblings? Just check their z-values.
    const QGraphicsItemPrivate *d1 = item1->d_ptr.data();
    const QGraphicsItemPrivate *d2 = item2->d_ptr.data();
    if (d1->parent == d2->parent)
        return qt_closestLeaf(item1, item2);

    // Find common ancestor, and each item's ancestor closest to the common
    // ancestor.
    int item1Depth = d1->depth();
    int item2Depth = d2->depth();
    const QGraphicsItem *p = item1;
    const QGraphicsItem *t1 = item1;
    while (item1Depth > item2Depth && (p = p->d_ptr->parent)) {
        if (p == item2) {
            // item2 is one of item1's ancestors; item1 is on top
            return !(t1->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t1 = p;
        --item1Depth;
    }
    p = item2;
    const QGraphicsItem *t2 = item2;
    while (item2Depth > item1Depth && (p = p->d_ptr->parent)) {
        if (p == item1) {
            // item1 is one of item2's ancestors; item1 is not on top
            return (t2->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent);
        }
        t2 = p;
        --item2Depth;
    }

    // item1Ancestor is now at the same level as item2Ancestor, but not the same.
    const QGraphicsItem *p1 = t1;
    const QGraphicsItem *p2 = t2;
    while (t1 && t1 != t2) {
        p1 = t1;
        p2 = t2;
        t1 = t1->d_ptr->parent;
        t2 = t2->d_ptr->parent;
    }

    // in case we have a common ancestor, we compare the immediate children in the ancestor's path.
    // otherwise we compare the respective items' topLevelItems directly.
    return qt_closestLeaf(p1, p2);
}